

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O2

TestInstance * __thiscall
vkt::
InstanceFactory1<vkt::sparse::(anonymous_namespace)::IndexBufferTestInstance,_unsigned_int,_vkt::sparse::(anonymous_namespace)::FunctionProgramsSimple1<unsigned_int>_>
::createInstance(InstanceFactory1<vkt::sparse::(anonymous_namespace)::IndexBufferTestInstance,_unsigned_int,_vkt::sparse::(anonymous_namespace)::FunctionProgramsSimple1<unsigned_int>_>
                 *this,Context *context)

{
  DrawGridTestInstance *this_00;
  
  this_00 = (DrawGridTestInstance *)operator_new(0x1a0);
  sparse::anon_unknown_0::DrawGridTestInstance::DrawGridTestInstance
            (this_00,context,this->m_arg0,0x40,0x1800);
  (this_00->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.super_TestInstance.
  _vptr_TestInstance = (_func_int **)&PTR__IndexBufferTestInstance_00c076c0;
  (this_00->super_SparseBufferTestInstance).super_Delegate._vptr_Delegate =
       (_func_int **)&DAT_00c076f8;
  *(undefined4 *)
   &this_00[1].super_SparseBufferTestInstance.super_SparseResourcesBaseInstance.super_TestInstance.
    _vptr_TestInstance = 0x300;
  this_00[1].super_SparseBufferTestInstance.super_SparseResourcesBaseInstance.super_TestInstance.
  m_context = (Context *)0x0;
  *(undefined8 *)
   &this_00[1].super_SparseBufferTestInstance.super_SparseResourcesBaseInstance.m_queues._M_t.
    _M_impl = 0;
  *(undefined8 *)
   &this_00[1].super_SparseBufferTestInstance.super_SparseResourcesBaseInstance.m_queues._M_t.
    _M_impl.super__Rb_tree_header._M_header = 0;
  *(_Base_ptr *)
   ((long)&this_00[1].super_SparseBufferTestInstance.super_SparseResourcesBaseInstance.m_queues._M_t
           ._M_impl.super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&this_00[1].super_SparseBufferTestInstance.super_SparseResourcesBaseInstance.m_queues._M_t
           ._M_impl.super__Rb_tree_header._M_header + 0x10) = (_Base_ptr)0x0;
  return (TestInstance *)this_00;
}

Assistant:

TestInstance*	createInstance		(Context& context) const { return new Instance(context, m_arg0); }